

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O3

uint8_t * AACCodec::findAacFrame(uint8_t *buffer,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  uint8_t *curBuf;
  
  if (buffer < end) {
    pbVar2 = buffer;
    do {
      bVar1 = *pbVar2;
      lVar3 = 2;
      if (0xef < bVar1) {
        if (pbVar2 < end + -1 && bVar1 == 0xff) {
          lVar3 = 1;
          if ((pbVar2[1] & 0xf6) == 0xf0) {
            return pbVar2;
          }
        }
        else {
          lVar3 = 1;
          if ((buffer < pbVar2 && (bVar1 & 0xf6) == 0xf0) && (pbVar2[-1] == 0xff)) {
            return pbVar2 + -1;
          }
        }
      }
      pbVar2 = pbVar2 + lVar3;
    } while (pbVar2 < end);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* AACCodec::findAacFrame(uint8_t* buffer, const uint8_t* end)
{
    uint8_t* curBuf = buffer;
    while (curBuf < end)
    {
        if (*curBuf < 0xf0)
            curBuf += 2;
        else if (*curBuf == 0xff && curBuf < end - 1 && (curBuf[1] & 0xf6) == 0xf0)
            return curBuf;
        else if ((*curBuf & 0xf6) == 0xf0 && curBuf > buffer && curBuf[-1] == 0xff)
            return curBuf - 1;
        else
            curBuf++;
    }
    return nullptr;
}